

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::GenerateBuildCommand
          (cmGlobalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeCommand,string *makeProgram,string *param_3,string *param_4,string *targetName,
          string *param_6,bool fast,bool param_8,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeOptions)

{
  Snapshot snapshot;
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  reference ppcVar4;
  cmMakefile *pcVar5;
  char *pcVar6;
  string local_1c8;
  undefined1 local_1a8 [8];
  string tname;
  string local_180;
  allocator local_159;
  string local_158;
  PositionType local_138;
  Snapshot local_128;
  cmLocalGenerator *local_110;
  cmLocalUnixMakefileGenerator3 *lg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  const_iterator local_e8;
  allocator local_d9;
  value_type local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator local_81;
  string local_80;
  string local_60;
  undefined1 local_3a;
  byte local_39;
  bool param_8_local;
  string *psStack_38;
  bool fast_local;
  string *targetName_local;
  string *param_4_local;
  string *param_3_local;
  string *makeProgram_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makeCommand_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  local_39 = fast;
  local_3a = param_8;
  psStack_38 = targetName;
  targetName_local = param_4;
  param_4_local = param_3;
  param_3_local = makeProgram;
  makeProgram_local = (string *)makeCommand;
  makeCommand_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"",&local_81);
  cmGlobalGenerator::SelectMakeProgram
            (&local_60,&this->super_cmGlobalGenerator,makeProgram,&local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(makeCommand,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[2])();
  bVar2 = cmHasLiteralPrefix<std::__cxx11::string,16ul>(&local_b8,(char (*) [16])"NMake Makefiles");
  std::__cxx11::string::~string((string *)&local_b8);
  psVar1 = makeProgram_local;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"/NOLOGO",&local_d9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)psVar1,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  }
  psVar1 = makeProgram_local;
  local_f0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)makeProgram_local);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_e8,&local_f0);
  local_f8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(makeOptions);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(makeOptions);
  lg = (cmLocalUnixMakefileGenerator3 *)
       std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
       insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                 ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)psVar1,
                  local_e8,local_f8,
                  (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   )local_100);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::empty
                      (&(this->super_cmGlobalGenerator).LocalGenerators);
    if (bVar2) {
      cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator(&local_138);
      cmState::Snapshot::Snapshot(&local_128,(cmState *)0x0,local_138);
      snapshot.Position.Tree = local_128.Position.Tree;
      snapshot.State = local_128.State;
      snapshot.Position.Position = local_128.Position.Position;
      local_110 = cmGlobalGenerator::MakeLocalGenerator
                            (&this->super_cmGlobalGenerator,snapshot,(cmLocalGenerator *)0x0);
      pcVar5 = cmLocalGenerator::GetMakefile(local_110);
      pcVar6 = cmake::GetHomeDirectory((this->super_cmGlobalGenerator).CMakeInstance);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_158,pcVar6,&local_159);
      cmMakefile::SetCurrentSourceDirectory(pcVar5,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      pcVar5 = cmLocalGenerator::GetMakefile(local_110);
      pcVar6 = cmake::GetHomeOutputDirectory((this->super_cmGlobalGenerator).CMakeInstance);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_180,pcVar6,(allocator *)(tname.field_2._M_local_buf + 0xf));
      cmMakefile::SetCurrentBinaryDirectory(pcVar5,&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator((allocator<char> *)(tname.field_2._M_local_buf + 0xf));
    }
    else {
      ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&(this->super_cmGlobalGenerator).LocalGenerators,0);
      local_110 = *ppcVar4;
    }
    std::__cxx11::string::string((string *)local_1a8,(string *)psStack_38);
    if ((local_39 & 1) != 0) {
      std::__cxx11::string::operator+=((string *)local_1a8,"/fast");
    }
    cmOutputConverter::Convert
              (&local_1c8,&local_110->super_cmOutputConverter,(string *)local_1a8,HOME_OUTPUT,
               UNCHANGED);
    std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    cmSystemTools::ConvertToOutputSlashes((string *)local_1a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)makeProgram_local,(value_type *)local_1a8);
    bVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::empty
                      (&(this->super_cmGlobalGenerator).LocalGenerators);
    if ((bVar2) && (local_110 != (value_type)0x0)) {
      (*local_110->_vptr_cmLocalGenerator[1])();
    }
    std::__cxx11::string::~string((string *)local_1a8);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3
::GenerateBuildCommand(std::vector<std::string>& makeCommand,
                       const std::string& makeProgram,
                       const std::string& /*projectName*/,
                       const std::string& /*projectDir*/,
                       const std::string& targetName,
                       const std::string& /*config*/,
                       bool fast, bool /*verbose*/,
                       std::vector<std::string> const& makeOptions)
{
  makeCommand.push_back(
    this->SelectMakeProgram(makeProgram)
    );

  // Since we have full control over the invocation of nmake, let us
  // make it quiet.
  if (cmHasLiteralPrefix(this->GetName(), "NMake Makefiles"))
    {
    makeCommand.push_back("/NOLOGO");
    }
  makeCommand.insert(makeCommand.end(),
                     makeOptions.begin(), makeOptions.end());
  if (!targetName.empty())
    {
    cmLocalUnixMakefileGenerator3 *lg;
    if (!this->LocalGenerators.empty())
      {
      lg = static_cast<cmLocalUnixMakefileGenerator3 *>
        (this->LocalGenerators[0]);
      }
    else
      {
      lg = static_cast<cmLocalUnixMakefileGenerator3 *>
        (this->MakeLocalGenerator());
      // set the Start directories
      lg->GetMakefile()->SetCurrentSourceDirectory
        (this->CMakeInstance->GetHomeDirectory());
      lg->GetMakefile()->SetCurrentBinaryDirectory
        (this->CMakeInstance->GetHomeOutputDirectory());
      }

    std::string tname = targetName;
    if(fast)
      {
      tname += "/fast";
      }
    tname = lg->Convert(tname,cmLocalGenerator::HOME_OUTPUT);
    cmSystemTools::ConvertToOutputSlashes(tname);
    makeCommand.push_back(tname);
    if (this->LocalGenerators.empty())
      {
      delete lg;
      }
    }
}